

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_monster_base(parser *p)

{
  monster_race *pmVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  parser_error pVar4;
  char *pcVar5;
  monster_base *pmVar6;
  long lVar7;
  ulong uVar8;
  angband_constants *paVar9;
  
  pcVar5 = (char *)parser_priv(p);
  if (pcVar5 != (char *)0x0) {
    pVar4 = PARSE_ERROR_NONE;
    if (*pcVar5 == '\0') {
      pcVar5 = parser_getsym(p,"name");
      pmVar6 = lookup_monster_base(pcVar5);
      if (pmVar6 == (monster_base *)0x0) {
        pVar4 = PARSE_ERROR_NO_KIND_FOUND;
      }
      else {
        wVar2 = parser_getint(p,"attr");
        wVar3 = parser_getint(p,"char");
        lVar7 = 8;
        pVar4 = PARSE_ERROR_NONE;
        paVar9 = z_info;
        for (uVar8 = 0; pmVar1 = r_info, uVar8 < paVar9->r_max; uVar8 = uVar8 + 1) {
          if (*(monster_base **)(r_info->flags + lVar7 + -0x3c) == pmVar6) {
            monster_x_attr[*(uint *)(r_info->flags + lVar7 + -0x5c)] = (uint8_t)wVar2;
            monster_x_char[*(uint *)(pmVar1->flags + lVar7 + -0x5c)] = wVar3;
            paVar9 = z_info;
          }
          lVar7 = lVar7 + 0xd0;
        }
      }
    }
    return pVar4;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x2c6,"enum parser_error parse_prefs_monster_base(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_monster_base(struct parser *p)
{
	const char *name;
	struct monster_base *mb;
	size_t i;
	uint8_t a;
	wchar_t c;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	name = parser_getsym(p, "name");
	mb = lookup_monster_base(name);
	if (!mb)
		return PARSE_ERROR_NO_KIND_FOUND;
	a = (uint8_t)parser_getint(p, "attr");
	c = (wchar_t)parser_getint(p, "char");

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		if (race->base != mb) continue;

		monster_x_attr[race->ridx] = a;
		monster_x_char[race->ridx] = c;
	}

	return PARSE_ERROR_NONE;
}